

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1a9d::DataTransform<unsigned_long,_unsigned_short>::Run
          (DataTransform<unsigned_long,_unsigned_short> *this,istream *input_stream)

{
  ulong uVar1;
  istream *in_RSI;
  long in_RDI;
  bool bVar2;
  longdouble in_ST0;
  longdouble lVar3;
  longdouble lVar4;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  ostringstream error_message;
  bool is_clipped;
  unsigned_short output_data;
  invalid_argument *anon_var_0;
  string word;
  unsigned_long input_data;
  int index;
  char buffer [128];
  allocator *in_stack_fffffffffffffd18;
  ostringstream *in_stack_fffffffffffffd20;
  ostream *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  undefined6 in_stack_fffffffffffffd38;
  undefined2 in_stack_fffffffffffffd3e;
  string *in_stack_fffffffffffffd40;
  allocator local_281;
  string local_280 [32];
  ostringstream local_260 [360];
  ostringstream *in_stack_ffffffffffffff08;
  string *in_stack_ffffffffffffff10;
  int local_d8;
  string local_c8 [32];
  ulong local_a8;
  int local_9c;
  char local_98 [128];
  istream *local_18;
  byte local_1;
  
  local_9c = 0;
  local_18 = in_RSI;
  do {
    if ((*(byte *)(in_RDI + 0x35) & 1) == 0) {
      bVar2 = sptk::ReadStream<unsigned_long>
                        ((unsigned_long *)in_stack_fffffffffffffd28,
                         (istream *)in_stack_fffffffffffffd20);
      if (!bVar2) goto LAB_0016638b;
    }
    else {
      in_stack_fffffffffffffd40 = local_c8;
      std::__cxx11::string::string(in_stack_fffffffffffffd40);
      std::operator>>(local_18,in_stack_fffffffffffffd40);
      uVar1 = std::__cxx11::string::empty();
      if ((uVar1 & 1) == 0) {
        std::__cxx11::stold((string *)in_stack_fffffffffffffd20,(size_t *)in_stack_fffffffffffffd18)
        ;
        in_stack_fffffffffffffd34 = SUB104(in_ST0,0);
        in_stack_fffffffffffffd38 = (undefined6)((unkuint10)in_ST0 >> 0x20);
        lVar3 = (longdouble)9.223372e+18;
        lVar4 = (longdouble)0;
        if (lVar3 <= in_ST0) {
          lVar4 = lVar3;
        }
        local_a8 = (long)ROUND(in_ST0 - lVar4) ^ (ulong)(lVar3 <= in_ST0) << 0x3f;
        local_d8 = 0;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
      }
      else {
        local_d8 = 2;
      }
      std::__cxx11::string::~string(local_c8);
      if (local_d8 != 0) {
        if (local_d8 != 1) {
LAB_0016638b:
          if (((*(byte *)(in_RDI + 0x36) & 1) != 0) && (local_9c % *(int *)(in_RDI + 0x28) != 0)) {
            std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          }
          local_1 = 1;
        }
        goto LAB_001663c7;
      }
      in_stack_fffffffffffffd30 = 0;
    }
    bVar2 = false;
    if (*(ushort *)(in_RDI + 0x38) < *(ushort *)(in_RDI + 0x3a)) {
      if (*(int *)(in_RDI + 0x2c) == 1) {
        if ((long)local_a8 < (long)(ulong)*(ushort *)(in_RDI + 0x38)) {
          bVar2 = true;
        }
        else {
          bVar2 = (long)(ulong)*(ushort *)(in_RDI + 0x3a) < (long)local_a8;
        }
      }
      else if (*(int *)(in_RDI + 0x2c) == 2) {
        if (local_a8 < *(ushort *)(in_RDI + 0x38)) {
          bVar2 = true;
        }
        else {
          bVar2 = *(ushort *)(in_RDI + 0x3a) < local_a8;
        }
      }
      else if (*(int *)(in_RDI + 0x2c) == 3) {
        if ((float)*(ushort *)(in_RDI + 0x38) <=
            *(float *)(&DAT_00196b40 + (ulong)((long)local_a8 < 0) * 4) + (float)(long)local_a8) {
          bVar2 = (float)*(ushort *)(in_RDI + 0x3a) <
                  *(float *)(&DAT_00196b40 + (ulong)((long)local_a8 < 0) * 4) +
                  (float)(long)local_a8;
          in_ST5 = in_ST4;
        }
        else {
          bVar2 = true;
        }
      }
    }
    if ((bVar2) && (*(int *)(in_RDI + 0x30) != 0)) {
      in_stack_fffffffffffffd20 = local_260;
      std::__cxx11::ostringstream::ostringstream(in_stack_fffffffffffffd20);
      in_stack_fffffffffffffd28 =
           (ostream *)std::ostream::operator<<(in_stack_fffffffffffffd20,local_9c);
      std::operator<<(in_stack_fffffffffffffd28,"th data is over the range of output type");
      in_stack_fffffffffffffd18 = &local_281;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_280,"x2x",in_stack_fffffffffffffd18);
      sptk::PrintErrorMessage(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      std::__cxx11::string::~string(local_280);
      std::allocator<char>::~allocator((allocator<char> *)&local_281);
      bVar2 = *(int *)(in_RDI + 0x30) == 2;
      if (bVar2) {
        local_1 = 0;
      }
      std::__cxx11::ostringstream::~ostringstream(local_260);
      if (bVar2) goto LAB_001663c7;
    }
    if ((*(byte *)(in_RDI + 0x36) & 1) == 0) {
      bVar2 = sptk::WriteStream<unsigned_short>
                        ((unsigned_short)((ulong)in_stack_fffffffffffffd20 >> 0x20),
                         (ostream *)in_stack_fffffffffffffd18);
      if (!bVar2) {
        local_1 = 0;
LAB_001663c7:
        return (bool)(local_1 & 1);
      }
    }
    else {
      bVar2 = sptk::SnPrintf<unsigned_short>
                        ((unsigned_short)((ulong)in_stack_fffffffffffffd40 >> 0x20),
                         (string *)CONCAT26(in_stack_fffffffffffffd3e,in_stack_fffffffffffffd38),
                         CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                         (char *)in_stack_fffffffffffffd28);
      if (!bVar2) {
        local_1 = 0;
        goto LAB_001663c7;
      }
      std::operator<<((ostream *)&std::cout,local_98);
      if ((local_9c + 1) % *(int *)(in_RDI + 0x28) == 0) {
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      }
      else {
        std::operator<<((ostream *)&std::cout,"\t");
      }
    }
    local_9c = local_9c + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }